

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O3

void ggml_opt_epoch_callback_progress_bar
               (bool train,ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,
               ggml_opt_result_t result,int64_t ibatch,int64_t ibatch_max,int64_t t_start_us)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  undefined7 in_register_00000039;
  long lVar5;
  long lVar6;
  long lVar7;
  int __c;
  double local_50;
  double local_48;
  double loss_unc;
  double loss;
  
  pcVar4 = "val:   ";
  if ((int)CONCAT71(in_register_00000039,train) != 0) {
    pcVar4 = "train: ";
  }
  lVar6 = 0;
  fprintf(_stderr,"%s[",pcVar4);
  lVar7 = 0x19;
  do {
    if (lVar6 / 0x19 < ibatch) {
      __c = 0x3d;
    }
    else if ((lVar6 - ibatch_max) / 0x19 < ibatch) {
      __c = 0x3e;
    }
    else {
      __c = 0x20;
    }
    fputc(__c,_stderr);
    lVar6 = lVar6 + ibatch_max;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  lVar7 = opt_ctx->inputs->ne[1];
  ggml_opt_result_loss(result,&loss,&loss_unc);
  if (result->ncorrect < 0) {
    local_48 = NAN;
  }
  else {
    lVar6 = result->ndata;
    local_48 = (double)result->ncorrect / (double)lVar6;
    if (1 < lVar6) {
      local_50 = ((1.0 - local_48) * local_48) / (double)(lVar6 + -1);
      if (local_50 < 0.0) {
        local_50 = sqrt(local_50);
      }
      else {
        local_50 = SQRT(local_50);
      }
      local_50 = local_50 * 100.0;
      goto LAB_00118415;
    }
  }
  local_50 = NAN;
LAB_00118415:
  iVar1 = ggml_time_us();
  lVar3 = iVar1 - t_start_us;
  lVar5 = (lVar3 / 3600000000) * -0xe10 + lVar3 / 1000000;
  lVar6 = ((ibatch_max - ibatch) * lVar3) / ibatch;
  lVar2 = lVar6 / 3600000000;
  lVar6 = lVar2 * -0xe10 + lVar6 / 1000000;
  fprintf(_stderr,
          "| data=%06ld/%06ld, loss=%.6lf+-%.6lf, accuracy=%.2lf+-%.2lf%%, t=%02ld:%02ld:%02ld, ETA=%02ld:%02ld:%02ld]\r"
          ,loss,loss_unc,local_48 * 100.0,local_50,lVar7 * ibatch,lVar7 * ibatch_max,
          lVar3 / 3600000000,lVar5 / 0x3c,lVar5 % 0x3c,lVar2,lVar6 / 0x3c,lVar6 % 0x3c);
  if (ibatch_max == ibatch) {
    fputc(10,_stderr);
  }
  fflush(_stderr);
  return;
}

Assistant:

void ggml_opt_epoch_callback_progress_bar(
        bool               train,
        ggml_opt_context_t opt_ctx,
        ggml_opt_dataset_t dataset,
        ggml_opt_result_t  result,
        int64_t            ibatch,
        int64_t            ibatch_max,
        int64_t            t_start_us) {
    fprintf(stderr, "%s[", train ? "train: " : "val:   ");

    constexpr int64_t bar_length = 25;
    for (int64_t j = 0; j < bar_length; ++j) {
        const int64_t ibatch_j = ibatch_max * j/bar_length;
        if (ibatch_j < ibatch) {
            fprintf(stderr, "=");
        } else if (ibatch_max * (j - 1)/bar_length < ibatch) {
            fprintf(stderr, ">");
        } else {
            fprintf(stderr, " ");
        }
    }

    const int64_t batch_size = ggml_opt_inputs(opt_ctx)->ne[1];
    const int64_t idata      = ibatch*batch_size;
    const int64_t idata_max  = ibatch_max*batch_size;

    double loss;
    double loss_unc;
    ggml_opt_result_loss(result, &loss, &loss_unc);

    double accuracy;
    double accuracy_unc;
    ggml_opt_result_accuracy(result, &accuracy, &accuracy_unc);

    const int64_t t_ibatch_us = ggml_time_us() - t_start_us;
    int64_t t_ibatch_s = t_ibatch_us / 1000000;
    const int64_t t_ibatch_h = t_ibatch_s / 3600;
    t_ibatch_s -= t_ibatch_h * 3600;
    const int64_t t_ibatch_m = t_ibatch_s / 60;
    t_ibatch_s -= t_ibatch_m * 60;

    const int64_t t_eta_us = t_ibatch_us * (ibatch_max - ibatch)/ibatch;
    int64_t t_eta_s = t_eta_us / 1000000;
    const int64_t t_eta_h = t_eta_s / 3600;
    t_eta_s -= t_eta_h * 3600;
    const int64_t t_eta_m = t_eta_s / 60;
    t_eta_s -= t_eta_m * 60;

    fprintf(stderr, "| data=%06" PRId64 "/%06" PRId64 ", loss=%.6lf+-%.6lf, accuracy=%.2lf+-%.2lf%%, "
            "t=%02" PRId64 ":%02" PRId64 ":%02" PRId64 ", ETA=%02" PRId64 ":%02" PRId64 ":%02" PRId64 "]\r",
            idata, idata_max, loss, loss_unc, 100.0*accuracy, 100.0*accuracy_unc,
            t_ibatch_h, t_ibatch_m, t_ibatch_s, t_eta_h, t_eta_m, t_eta_s);
    if (ibatch == ibatch_max) {
        fprintf(stderr, "\n");
    }
    fflush(stderr);

    GGML_UNUSED(dataset);
}